

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O0

void __thiscall Sexp::DumpAtom(Sexp *this,ostream *stream)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ostream *stream_local;
  Sexp *this_local;
  
  bVar1 = IsString(this);
  if (bVar1) {
    poVar2 = std::operator<<(stream,"\"");
    poVar2 = std::operator<<(poVar2,(this->field_1).string_value);
    std::operator<<(poVar2,"\"");
  }
  else {
    bVar1 = IsSymbol(this);
    if (bVar1) {
      psVar3 = SymbolInterner::GetSymbol_abi_cxx11_((this->field_1).symbol_value);
      std::operator<<(stream,(string *)psVar3);
    }
    else {
      bVar1 = IsFixnum(this);
      if (bVar1) {
        std::ostream::operator<<(stream,(this->field_1).fixnum_value);
      }
      else {
        bVar1 = IsBool(this);
        if (bVar1) {
          if (((this->field_1).bool_value & 1U) == 0) {
            std::operator<<(stream,"#f");
          }
          else {
            std::operator<<(stream,"#t");
          }
        }
        else {
          bVar1 = IsEof(this);
          if (bVar1) {
            std::operator<<(stream,"#eof");
          }
          else {
            bVar1 = IsEmpty(this);
            if (bVar1) {
              std::operator<<(stream,"()");
            }
            else {
              bVar1 = IsActivation(this);
              if (bVar1) {
                std::operator<<(stream,"#<activation>");
              }
              else {
                bVar1 = IsFunction(this);
                if (bVar1) {
                  std::operator<<(stream,"#<function>");
                }
                else {
                  bVar1 = IsNativeFunction(this);
                  if (bVar1) {
                    std::operator<<(stream,"#<native function>");
                  }
                  else {
                    bVar1 = IsMeaning(this);
                    if (!bVar1) {
                      if (this->padding != 0xabababababababab) {
                        PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                                  ,0x7b,"DumpAtom","unknown s-expression!");
                      }
                      PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                                ,0x78,"DumpAtom","probable heap corruption detected!");
                    }
                    (*(code *)(((this->field_1).activation)->parent->field_1).symbol_value)
                              ((this->field_1).activation,stream);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Sexp::DumpAtom(std::ostream &stream) const {
  if (IsString()) {
    stream << "\"" << this->string_value << "\"";
    return;
  }

  if (IsSymbol()) {
    stream << SymbolInterner::GetSymbol(this->symbol_value);
    return;
  }

  if (IsFixnum()) {
    stream << this->fixnum_value;
    return;
  }

  if (IsBool()) {
    if (this->bool_value) {
      stream << "#t";
    } else {
      stream << "#f";
    }

    return;
  }

  if (IsEof()) {
    stream << "#eof";
    return;
  }

  if (IsEmpty()) {
    stream << "()";
    return;
  }

  if (IsActivation()) {
    stream << "#<activation>";
    return;
  }

  if (IsFunction()) {
    stream << "#<function>";
    return;
  }

  if (IsNativeFunction()) {
    stream << "#<native function>";
    return;
  }

  if (IsMeaning()) {
    this->meaning->Dump(stream);
    return;
  }

  if (padding == 0xabababababababab) {
    PANIC("probable heap corruption detected!");
  }

  PANIC("unknown s-expression!");
}